

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::SyncRepeatedFieldWithMapNoLock(MapFieldBase *this)

{
  ArenaImpl *in_RDI;
  size_t n;
  Arena **in_stack_ffffffffffffff68;
  __pointer_type ptr;
  __pointer_type allocated_type;
  Arena *in_stack_ffffffffffffff80;
  ArenaImpl *this_00;
  RepeatedPtrField<google::protobuf::Message> *local_38;
  
  if ((in_RDI->space_allocated_).super___atomic_base<unsigned_long>._M_i == 0) {
    ptr = (in_RDI->hint_)._M_b._M_p;
    if (ptr == (__pointer_type)0x0) {
      local_38 = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
      RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField
                ((RepeatedPtrField<google::protobuf::Message> *)0x42882f);
    }
    else {
      allocated_type = ptr;
      this_00 = in_RDI;
      AlignUpTo8(0x18);
      Arena::AllocHook(in_stack_ffffffffffffff80,(type_info *)allocated_type,(size_t)ptr);
      ArenaImpl::AllocateAlignedAndAddCleanup
                (this_00,(size_t)in_RDI,(_func_void_void_ptr *)in_stack_ffffffffffffff80);
      local_38 = Arena::
                 InternalHelper<google::protobuf::RepeatedPtrField<google::protobuf::Message>>::
                 Construct<google::protobuf::Arena*>(ptr,in_stack_ffffffffffffff68);
    }
    (in_RDI->space_allocated_).super___atomic_base<unsigned_long>._M_i = (__int_type)local_38;
  }
  return;
}

Assistant:

void MapFieldBase::SyncRepeatedFieldWithMapNoLock() const {
  if (repeated_field_ == NULL) {
    repeated_field_ = Arena::CreateMessage<RepeatedPtrField<Message> >(arena_);
  }
}